

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

char * cmsys::regbranch(int *flagp)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  byte *p;
  size_t sVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint unaff_EBX;
  byte bVar9;
  long lVar10;
  char *pcVar11;
  byte *pbVar12;
  byte *p_00;
  uint local_3c;
  
  *flagp = 0;
  pbVar2 = regcode;
  if (regcode == &regdummy) {
    regsize = regsize + 3;
  }
  else {
    regcode[0] = 6;
    regcode[1] = 0;
    regcode[2] = 0;
    regcode = regcode + 3;
  }
  p_00 = (byte *)0x0;
LAB_0013837a:
  p = regcode;
  pbVar8 = regparse;
  bVar9 = *regparse;
  if (((bVar9 == 0) || (bVar9 == 0x29)) || (bVar9 == 0x7c)) {
    if (p_00 == (byte *)0x0) {
      if (regcode == &regdummy) {
        regsize = regsize + 3;
      }
      else {
        regcode[0] = 9;
        regcode[1] = 0;
        regcode[2] = 0;
        regcode = regcode + 3;
      }
    }
    return (char *)pbVar2;
  }
  pbVar7 = regparse + 1;
  if (bVar9 < 0x3f) {
    switch(bVar9) {
    case 0x24:
      if (regcode == &regdummy) {
LAB_00138566:
        regsize = regsize + 3;
        regparse = pbVar7;
      }
      else {
        regparse = pbVar7;
        regcode[0] = 2;
        regcode[1] = 0;
LAB_0013846e:
        regcode[2] = 0;
        regcode = regcode + 3;
      }
      uVar4 = 0;
      goto LAB_001387a0;
    default:
      goto switchD_001383c9_caseD_25;
    case 0x28:
      regparse = pbVar7;
      p = (byte *)reg(1,(int *)&local_3c);
      if (p != (byte *)0x0) {
        uVar4 = local_3c & 5;
        goto LAB_001387a0;
      }
      break;
    case 0x2a:
    case 0x2b:
switchD_001383c9_caseD_2a:
      pcVar11 = "RegularExpression::compile(): ?+* follows nothing.";
      regparse = pbVar7;
      goto LAB_00138436;
    case 0x2e:
      if (regcode == &regdummy) {
        regsize = regsize + 3;
        regparse = pbVar7;
      }
      else {
        regparse = pbVar7;
        regcode[0] = 3;
        regcode[1] = 0;
        regcode[2] = 0;
        regcode = regcode + 3;
      }
      goto LAB_0013879b;
    }
    goto LAB_0013843b;
  }
  if (bVar9 < 0x5c) {
    if (bVar9 == 0x3f) goto switchD_001383c9_caseD_2a;
    if (bVar9 == 0x5b) {
      if (*pbVar7 == 0x5e) {
        if (regcode == &regdummy) {
          regsize = regsize + 3;
        }
        else {
          regcode[0] = 5;
          regcode[1] = 0;
          regcode[2] = 0;
          regcode = regcode + 3;
        }
        regparse = regparse + 2;
      }
      else if (regcode == &regdummy) {
        regsize = regsize + 3;
        regparse = pbVar7;
      }
      else {
        regparse = pbVar7;
        regcode[0] = 4;
        regcode[1] = 0;
        regcode[2] = 0;
        regcode = regcode + 3;
      }
      bVar9 = *regparse;
      pbVar8 = regcode;
      if ((bVar9 == 0x5d) || (pbVar7 = regparse, lVar10 = regsize, bVar9 == 0x2d)) {
        pbVar7 = regparse + 1;
        regparse = pbVar7;
        if (regcode == &regdummy) {
          regsize = regsize + 1;
          lVar10 = regsize;
        }
        else {
          pbVar8 = regcode + 1;
          *regcode = bVar9;
          regcode = pbVar8;
          pbVar8 = regcode;
          pbVar7 = regparse;
          lVar10 = regsize;
        }
      }
      do {
        while (bVar9 = *pbVar7, bVar9 == 0x2d) {
          regparse = pbVar7 + 1;
          bVar9 = pbVar7[1];
          if ((bVar9 == 0x5d) || (bVar9 == 0)) {
            bVar9 = 0x2d;
            if (pbVar8 == &regdummy) {
              regsize = lVar10 + 1;
              pbVar7 = regparse;
              lVar10 = regsize;
            }
            else {
LAB_001386e3:
              regparse = pbVar7 + 1;
              regcode = pbVar8 + 1;
              *pbVar8 = bVar9;
              pbVar8 = pbVar8 + 1;
              pbVar7 = pbVar7 + 1;
            }
          }
          else {
            bVar1 = pbVar7[-1];
            uVar4 = (uint)bVar1;
            if (bVar9 < bVar1) {
              pcVar11 = "RegularExpression::compile(): Invalid range in [].";
              goto LAB_00138436;
            }
            pbVar12 = pbVar8;
            if (bVar1 < bVar9) {
              do {
                if (pbVar12 == &regdummy) {
                  lVar10 = lVar10 + 1;
                  regsize = lVar10;
                }
                else {
                  pbVar8 = pbVar12 + 1;
                  regcode = pbVar8;
                  *pbVar12 = (char)uVar4 + 1;
                  pbVar12 = pbVar8;
                }
                uVar4 = uVar4 + 1;
              } while (bVar9 != uVar4);
            }
            pbVar7 = pbVar7 + 2;
            regparse = pbVar7;
          }
        }
        if ((bVar9 == 0) || (bVar9 == 0x5d)) goto LAB_00138765;
        regparse = pbVar7 + 1;
        if (pbVar8 != &regdummy) goto LAB_001386e3;
        regsize = lVar10 + 1;
        pbVar7 = regparse;
        lVar10 = regsize;
      } while( true );
    }
  }
  else {
    if (bVar9 == 0x5c) {
      if (*pbVar7 != 0) {
        if (regcode == &regdummy) {
          regsize = regsize + 3;
        }
        else {
          regcode[0] = 8;
          regcode[1] = 0;
          regcode[2] = 0;
          regcode = regcode + 3;
        }
        regparse = regparse + 2;
        if (regcode == &regdummy) {
          regsize = regsize + 1;
        }
        else {
          pbVar8 = regcode + 1;
          *regcode = *pbVar7;
          regcode = pbVar8;
        }
        if (regcode == &regdummy) {
          regsize = regsize + 1;
        }
        else {
          pbVar8 = regcode + 1;
          *regcode = 0;
          regcode = pbVar8;
        }
        goto LAB_0013879b;
      }
      pcVar11 = "RegularExpression::compile(): Trailing backslash.";
      regparse = pbVar7;
      goto LAB_00138436;
    }
    if (bVar9 == 0x5e) {
      if (regcode == &regdummy) goto LAB_00138566;
      regparse = pbVar7;
      regcode[0] = 1;
      regcode[1] = 0;
      goto LAB_0013846e;
    }
  }
switchD_001383c9_caseD_25:
  sVar5 = strcspn((char *)regparse,"^$.[()|?+*\\");
  p = regcode;
  uVar4 = (uint)sVar5;
  if ((int)uVar4 < 1) {
    pcVar11 = "RegularExpression::compile(): Internal error.";
    goto LAB_00138436;
  }
  uVar3 = 1;
  if (((uVar4 != 1) && (uVar3 = uVar4, (ulong)pbVar8[uVar4 & 0x7fffffff] < 0x40)) &&
     ((0x80000c0000000000U >> ((ulong)pbVar8[uVar4 & 0x7fffffff] & 0x3f) & 1) != 0)) {
    uVar3 = uVar4 - 1;
  }
  if (regcode == &regdummy) {
    regsize = regsize + 3;
  }
  else {
    regcode[0] = 8;
    regcode[1] = 0;
    regcode[2] = 0;
    regcode = regcode + 3;
  }
  if (0 < (int)uVar3) {
    iVar6 = uVar3 + 1;
    lVar10 = regsize;
    pbVar8 = regcode;
    do {
      if (pbVar8 == &regdummy) {
        lVar10 = lVar10 + 1;
        regsize = lVar10;
      }
      else {
        regcode = pbVar8 + 1;
        *pbVar8 = *regparse;
        pbVar8 = pbVar8 + 1;
      }
      regparse = regparse + 1;
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  uVar4 = (uint)(uVar3 == 1) * 2 + 1;
  if (regcode == &regdummy) {
    regsize = regsize + 1;
  }
  else {
    pbVar8 = regcode + 1;
    *regcode = 0;
    regcode = pbVar8;
  }
  goto LAB_001387a0;
LAB_00138765:
  if (regcode == &regdummy) {
    regsize = regsize + 1;
  }
  else {
    pbVar8 = regcode + 1;
    *regcode = 0;
    regcode = pbVar8;
  }
  if (*pbVar7 == 0x5d) {
    regparse = pbVar7 + 1;
LAB_0013879b:
    uVar4 = 3;
  }
  else {
    pcVar11 = "RegularExpression::compile(): Unmatched [].";
LAB_00138436:
    puts(pcVar11);
LAB_0013843b:
    uVar4 = 0;
    p = (byte *)0x0;
  }
LAB_001387a0:
  pbVar8 = regcode;
  if (p != (byte *)0x0) {
    bVar9 = *regparse;
    if ((0x3f < (ulong)bVar9) || ((0x80000c0000000000U >> ((ulong)bVar9 & 0x3f) & 1) == 0))
    goto LAB_00138ba8;
    pcVar11 = "RegularExpression::compile() : *+ operand could be empty.";
    if ((uVar4 & 1) != 0 || bVar9 == 0x3f) {
      if (bVar9 == 0x2a) {
        if ((uVar4 & 2) == 0) {
          if (regcode == &regdummy) {
            regsize = regsize + 3;
          }
          else {
            pbVar7 = regcode + 3;
            for (; regcode = pbVar7, p < pbVar8; pbVar8 = pbVar8 + -1) {
              pbVar8[2] = pbVar8[-1];
              pbVar7 = regcode;
            }
            p[0] = 6;
            p[1] = 0;
            p[2] = 0;
          }
          pbVar8 = regcode;
          if (regcode == &regdummy) {
            regsize = regsize + 3;
          }
          else {
            regcode[0] = 7;
            regcode[1] = 0;
            regcode[2] = 0;
            regcode = regcode + 3;
          }
          if (p != &regdummy) {
            if (*p == 6) {
              regtail((char *)(p + 3),(char *)pbVar8);
            }
            if ((p != &regdummy) && (*p == 6)) {
              regtail((char *)(p + 3),(char *)p);
            }
          }
          pbVar8 = regcode;
          if (regcode == &regdummy) {
            regsize = regsize + 3;
          }
          else {
            regcode[0] = 6;
            regcode[1] = 0;
            regcode[2] = 0;
            regcode = regcode + 3;
          }
          regtail((char *)p,(char *)pbVar8);
          pbVar8 = regcode;
          if (regcode == &regdummy) {
            regsize = regsize + 3;
          }
          else {
            regcode[0] = 9;
            regcode[1] = 0;
            regcode[2] = 0;
            regcode = regcode + 3;
          }
          regtail((char *)p,(char *)pbVar8);
        }
        else if (regcode == &regdummy) {
LAB_00138954:
          regsize = regsize + 3;
        }
        else {
          pbVar7 = regcode + 3;
          for (; regcode = pbVar7, p < pbVar8; pbVar8 = pbVar8 + -1) {
            pbVar8[2] = pbVar8[-1];
            pbVar7 = regcode;
          }
          p[0] = 10;
          p[1] = 0;
LAB_0013894a:
          p[2] = 0;
        }
      }
      else if (bVar9 == 0x2b) {
        if ((uVar4 & 2) != 0) {
          if (regcode == &regdummy) goto LAB_00138954;
          pbVar7 = regcode + 3;
          for (; regcode = pbVar7, p < pbVar8; pbVar8 = pbVar8 + -1) {
            pbVar8[2] = pbVar8[-1];
            pbVar7 = regcode;
          }
          p[0] = 0xb;
          p[1] = 0;
          goto LAB_0013894a;
        }
        if (regcode == &regdummy) {
          regsize = regsize + 3;
        }
        else {
          regcode[0] = 6;
          regcode[1] = 0;
          regcode[2] = 0;
          regcode = regcode + 3;
        }
        regtail((char *)p,(char *)pbVar8);
        pbVar7 = regcode;
        if (regcode == &regdummy) {
          regsize = regsize + 3;
        }
        else {
          regcode[0] = 7;
          regcode[1] = 0;
          regcode[2] = 0;
          regcode = regcode + 3;
        }
        regtail((char *)pbVar7,(char *)p);
        pbVar7 = regcode;
        if (regcode == &regdummy) {
          regsize = regsize + 3;
        }
        else {
          regcode[0] = 6;
          regcode[1] = 0;
          regcode[2] = 0;
          regcode = regcode + 3;
        }
        regtail((char *)pbVar8,(char *)pbVar7);
        pbVar8 = regcode;
        pbVar7 = p;
        if (regcode == &regdummy) {
          regsize = regsize + 3;
        }
        else {
          regcode[0] = 9;
          regcode[1] = 0;
          regcode[2] = 0;
          regcode = regcode + 3;
        }
LAB_00138b5d:
        regtail((char *)pbVar7,(char *)pbVar8);
      }
      else if (bVar9 == 0x3f) {
        if (regcode == &regdummy) {
          regsize = regsize + 3;
        }
        else {
          pbVar7 = regcode + 3;
          for (; regcode = pbVar7, p < pbVar8; pbVar8 = pbVar8 + -1) {
            pbVar8[2] = pbVar8[-1];
            pbVar7 = regcode;
          }
          p[0] = 6;
          p[1] = 0;
          p[2] = 0;
        }
        pbVar8 = regcode;
        if (regcode == &regdummy) {
          regsize = regsize + 3;
        }
        else {
          regcode[0] = 6;
          regcode[1] = 0;
          regcode[2] = 0;
          regcode = regcode + 3;
        }
        regtail((char *)p,(char *)pbVar8);
        pbVar8 = regcode;
        if (regcode == &regdummy) {
          regsize = regsize + 3;
        }
        else {
          regcode[0] = 9;
          regcode[1] = 0;
          regcode[2] = 0;
          regcode = regcode + 3;
        }
        regtail((char *)p,(char *)pbVar8);
        if ((p != &regdummy) && (*p == 6)) {
          pbVar7 = p + 3;
          goto LAB_00138b5d;
        }
      }
      uVar4 = (uint)(bVar9 != 0x2b) * 3 + 1;
      pbVar8 = regparse + 1;
      pbVar7 = regparse + 1;
      regparse = pbVar8;
      if ((0x3f < (ulong)*pbVar7) ||
         (pcVar11 = "RegularExpression::compile(): Nested *?+.", unaff_EBX = uVar4,
         (0x80000c0000000000U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) goto LAB_00138ba8;
    }
    puts(pcVar11);
  }
  uVar4 = unaff_EBX;
  p = (byte *)0x0;
LAB_00138ba8:
  if (p == (byte *)0x0) {
    return (char *)0x0;
  }
  uVar3 = uVar4 & 1 | *flagp;
  *flagp = uVar3;
  unaff_EBX = uVar4;
  if (p_00 == (byte *)0x0) {
    *flagp = uVar3 | uVar4 & 4;
    p_00 = p;
  }
  else {
    regtail((char *)p_00,(char *)p);
    p_00 = p;
  }
  goto LAB_0013837a;
}

Assistant:

static char* regbranch (int *flagp) {
    char* ret;
    char* chain;
    char* latest;
    int   flags;

    *flagp = WORST;             // Tentatively.

    ret = regnode(BRANCH);
    chain = 0;
    while (*regparse != '\0' && *regparse != '|' && *regparse != ')') {
        latest = regpiece(&flags);
        if (latest == 0)
            return (0);
        *flagp |= flags & HASWIDTH;
        if (chain == 0) // First piece.
            *flagp |= flags & SPSTART;
        else
            regtail(chain, latest);
        chain = latest;
    }
    if (chain == 0)             // Loop ran zero times.
        regnode(NOTHING);

    return (ret);
}